

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QString * QtPrivate::QCalendarDateSectionValidator::highlightString
                    (QString *__return_storage_ptr__,QString *str,int pos)

{
  long n;
  long in_FS_OFFSET;
  QStringView QVar1;
  QStringView local_98;
  QStringView local_88;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView>,_QLatin1String>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos == 0) {
    local_78.a.a.a.m_data = L"<b>";
    local_78.a.a.a.m_size = 3;
    local_78.a.a.b.m_data = (char *)0x4;
    local_78.a.b.m_data = (storage_type_conflict *)local_78.a.b.m_size;
    local_78.a.b.m_size = (qsizetype)"</b>";
    local_78.a.a.b.m_size = (qsizetype)str;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>(__return_storage_ptr__,
                       (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
                        *)&local_78);
  }
  else {
    local_88.m_size = (str->d).size;
    local_88.m_data = (str->d).ptr;
    n = (long)((int)local_88.m_size - pos);
    QVar1 = QStringView::mid(&local_88,0,n);
    local_98.m_data = (str->d).ptr;
    local_98.m_size = (str->d).size;
    local_78.a.b = QStringView::mid(&local_98,n,(long)pos);
    local_78.a.a.b.m_size = 3;
    local_78.a.a.b.m_data = "<b>";
    local_78.b.m_size = 4;
    local_78.b.m_data = "</b>";
    local_78.a.a.a = QVar1;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView>,_QLatin1String>
    ::convertTo<QString>(__return_storage_ptr__,&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateSectionValidator::highlightString(const QString &str, int pos)
{
    if (pos == 0)
        return "<b>"_L1 + str + "</b>"_L1;
    int startPos = str.size() - pos;
    return QStringView{str}.mid(0, startPos) + "<b>"_L1 + QStringView{str}.mid(startPos, pos) + "</b>"_L1;

}